

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

void append_reverse_ulong(xmlZMemBuff *buff,unsigned_long data)

{
  Bytef **ppBVar1;
  int iVar2;
  bool bVar3;
  
  if (buff != (xmlZMemBuff *)0x0) {
    iVar2 = 4;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      *(buff->zctrl).next_out = (Bytef)data;
      data = data >> 8;
      ppBVar1 = &(buff->zctrl).next_out;
      *ppBVar1 = *ppBVar1 + 1;
    }
  }
  return;
}

Assistant:

static void
append_reverse_ulong( xmlZMemBuff * buff, unsigned long data ) {

    int		idx;

    if ( buff == NULL )
	return;

    /*
    **  This is plagiarized from putLong in gzio.c (zlib source) where
    **  the number "4" is hardcoded.  If zlib is ever patched to
    **  support 64 bit file sizes, this code would need to be patched
    **  as well.
    */

    for ( idx = 0; idx < 4; idx++ ) {
	*buff->zctrl.next_out = ( data & 0xff );
	data >>= 8;
	buff->zctrl.next_out++;
    }

    return;
}